

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O3

void mpiabi_win_create_(void *base,MPIABI_Fint *size,MPIABI_Fint *disp_unit,MPIABI_Fint *info,
                       MPIABI_Fint *comm,MPIABI_Fint *win,MPIABI_Fint *ierror)

{
  mpi_win_create_();
  return;
}

Assistant:

void mpiabi_win_create_(
  void * base,
  const MPIABI_Fint * size,
  const MPIABI_Fint * disp_unit,
  const MPIABI_Fint * info,
  const MPIABI_Fint * comm,
  MPIABI_Fint * win,
  MPIABI_Fint * ierror
) {
  return mpi_win_create_(
    base,
    size,
    disp_unit,
    info,
    comm,
    win,
    ierror
  );
}